

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall glslang::TBuiltInParseables::TBuiltInParseables(TBuiltInParseables *this)

{
  long lVar1;
  
  this->_vptr_TBuiltInParseables = (_func_int **)&PTR__TBuiltIns_0089fcc0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->commonBuiltins);
  lVar1 = 0x30;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 ((long)this->stageBuiltins + lVar1 + -0x30));
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x260);
  return;
}

Assistant:

TBuiltInParseables::TBuiltInParseables()
{
}